

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

int BackwardReferencesLz77
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  PixOrCopy v;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int len_ini;
  int iVar11;
  
  iVar10 = xsize * ysize;
  VP8LClearBackwardRefs((VP8LBackwardRefs *)hash_chain);
  iVar11 = 0;
  iVar4 = -1;
  do {
    if (iVar10 <= iVar11) {
      return (int)(*(int *)((long)&hash_chain->offset_length_ + 4) == 0);
    }
    uVar1 = *(uint *)(*(long *)CONCAT44(in_register_0000000c,cache_bits) + (long)iVar11 * 4);
    uVar3 = uVar1 & 0xfff;
    if (uVar3 < 4) {
LAB_0013ac19:
      v = (PixOrCopy)((ulong)argb[iVar11] << 0x20 | 0x10000);
      uVar3 = 1;
    }
    else {
      iVar2 = uVar3 + iVar11;
      if (iVar10 <= (int)(uVar3 + iVar11)) {
        iVar2 = iVar10 + -1;
      }
      if (iVar4 < iVar11) {
        iVar4 = iVar11;
      }
      lVar6 = (long)iVar4;
      iVar7 = 0;
      do {
        do {
          if (iVar2 <= lVar6) goto LAB_0013ac14;
          uVar8 = *(uint *)(*(long *)CONCAT44(in_register_0000000c,cache_bits) + 4 + lVar6 * 4) &
                  0xfff;
          lVar6 = lVar6 + 1;
          if (uVar8 < 4) {
            uVar8 = 1;
          }
          iVar5 = (int)lVar6;
          iVar9 = uVar8 + iVar5;
        } while (iVar9 <= iVar7);
        uVar3 = iVar5 - iVar11;
        iVar7 = iVar9;
      } while (iVar9 < iVar10);
      uVar3 = iVar5 - iVar11;
LAB_0013ac14:
      if (uVar3 == 1) goto LAB_0013ac19;
      v = (PixOrCopy)(CONCAT44(uVar1 >> 0xc,uVar3 << 0x10) + 2);
    }
    VP8LBackwardRefsCursorAdd((VP8LBackwardRefs *)hash_chain,v);
    iVar11 = iVar11 + uVar3;
  } while( true );
}

Assistant:

static int BackwardReferencesLz77(int xsize, int ysize,
                                  const uint32_t* const argb, int cache_bits,
                                  const VP8LHashChain* const hash_chain,
                                  VP8LBackwardRefs* const refs) {
  int i;
  int i_last_check = -1;
  int ok = 0;
  int cc_init = 0;
  const int use_color_cache = (cache_bits > 0);
  const int pix_count = xsize * ysize;
  VP8LColorCache hashers;

  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }
  VP8LClearBackwardRefs(refs);
  for (i = 0; i < pix_count;) {
    // Alternative#1: Code the pixels starting at 'i' using backward reference.
    int offset = 0;
    int len = 0;
    int j;
    VP8LHashChainFindCopy(hash_chain, i, &offset, &len);
    if (len >= MIN_LENGTH) {
      const int len_ini = len;
      int max_reach = 0;
      const int j_max =
          (i + len_ini >= pix_count) ? pix_count - 1 : i + len_ini;
      // Only start from what we have not checked already.
      i_last_check = (i > i_last_check) ? i : i_last_check;
      // We know the best match for the current pixel but we try to find the
      // best matches for the current pixel AND the next one combined.
      // The naive method would use the intervals:
      // [i,i+len) + [i+len, length of best match at i+len)
      // while we check if we can use:
      // [i,j) (where j<=i+len) + [j, length of best match at j)
      for (j = i_last_check + 1; j <= j_max; ++j) {
        const int len_j = VP8LHashChainFindLength(hash_chain, j);
        const int reach =
            j + (len_j >= MIN_LENGTH ? len_j : 1);  // 1 for single literal.
        if (reach > max_reach) {
          len = j - i;
          max_reach = reach;
          if (max_reach >= pix_count) break;
        }
      }
    } else {
      len = 1;
    }
    // Go with literal or backward reference.
    assert(len > 0);
    if (len == 1) {
      AddSingleLiteral(argb[i], use_color_cache, &hashers, refs);
    } else {
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(offset, len));
      if (use_color_cache) {
        for (j = i; j < i + len; ++j) VP8LColorCacheInsert(&hashers, argb[j]);
      }
    }
    i += len;
  }

  ok = !refs->error_;
 Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  return ok;
}